

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcm.c
# Opt level: O1

void mcmcliexp(mcmcxdef *cctx,mcmon clinum)

{
  mcmon *__s;
  ulong uVar1;
  undefined6 in_register_00000032;
  
  uVar1 = CONCAT62(in_register_00000032,clinum) >> 8 & 0xffffff;
  if (cctx->mcmcxmtb[uVar1] != (mcmon *)0x0) {
    return;
  }
  __s = (mcmon *)mchalo(cctx->mcmcxgl->mcmcxerr,0x200,"client mapping page");
  cctx->mcmcxmtb[uVar1] = __s;
  memset(__s,0xff,0x200);
  return;
}

Assistant:

static void mcmcliexp(mcmcxdef *cctx, mcmon clinum)
{
    /* add global number to client mapping table at client number */
    if (cctx->mcmcxmtb[clinum >> 8] == (mcmon *)0)
    {
        mcmcx1def *ctx = cctx->mcmcxgl;
        int        i;
        mcmon     *p;
        
        /* this page is not allocated - allocate it */
        p = (mcmon *)mchalo(ctx->mcmcxerr, (256 * sizeof(mcmon)),
                            "client mapping page");
        cctx->mcmcxmtb[clinum >> 8] = p;
        for (i = 0 ; i < 256 ; ++i) *p++ = MCMONINV;
    }
}